

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadrilateral.cpp
# Opt level: O2

void pztopology::TPZQuadrilateral::ComputeDirections
               (int side,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *sidevectors)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  TPZFMatrix<double> t1vec;
  TPZFMatrix<double> bvec;
  
  if ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol == 2) {
    TPZFMatrix<double>::TPZFMatrix(&bvec,2,0x12);
    TPZFMatrix<double>::TPZFMatrix(&t1vec,2,0x12);
    TPZFMatrix<double>::Redim(&bvec,2,0x12);
    TPZFMatrix<double>::Redim(&t1vec,2,0x12);
    (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xe])(directions,3,0x12);
    lVar2 = 0;
    for (lVar3 = 0; lVar3 != 0x12; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 8) {
        *(undefined8 *)((long)bvec.fElem + lVar4) = *(undefined8 *)((long)&bQuad + lVar2 + lVar4);
        *(undefined8 *)((long)t1vec.fElem + lVar4) = *(undefined8 *)((long)&tQuad + lVar2 + lVar4);
      }
      lVar2 = lVar2 + 0x10;
      bvec.fElem = bvec.fElem + bvec.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
      t1vec.fElem = t1vec.fElem + t1vec.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
    }
    switch(side) {
    case 0:
    case 1:
    case 2:
    case 3:
      break;
    case 4:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(0,2,&bvec,&t1vec,gradx,directions);
      piVar1 = sidevectors->fStore;
      for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
        *(undefined4 *)((long)piVar1 + lVar2) = *(undefined4 *)((long)&vectorsideorder + lVar2);
      }
      break;
    case 5:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(3,5,&bvec,&t1vec,gradx,directions);
      piVar1 = sidevectors->fStore;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        piVar1[lVar2] = (&DAT_012fb4fc)[lVar2];
      }
      break;
    case 6:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(6,8,&bvec,&t1vec,gradx,directions);
      piVar1 = sidevectors->fStore;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        piVar1[lVar2] = (&DAT_012fb508)[lVar2];
      }
      break;
    case 7:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(9,0xb,&bvec,&t1vec,gradx,directions);
      piVar1 = sidevectors->fStore;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        piVar1[lVar2] = (&DAT_012fb514)[lVar2];
      }
      break;
    case 8:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3,6);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,6);
      computedirectionsq(0xc,0x11,&bvec,&t1vec,gradx,directions);
      piVar1 = sidevectors->fStore;
      for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
        piVar1[lVar2] = (&DAT_012fb520)[lVar2];
      }
      break;
    default:
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzquadrilateral.cpp"
                 ,0x44c);
    }
    TPZFMatrix<double>::~TPZFMatrix(&t1vec);
    TPZFMatrix<double>::~TPZFMatrix(&bvec);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzquadrilateral.cpp"
             ,0x3ef);
}

Assistant:

void TPZQuadrilateral::ComputeDirections(int side, TPZFMatrix<REAL> &gradx, TPZFMatrix<REAL> &directions, TPZVec<int> &sidevectors)
    {
        if(gradx.Cols()!=2)
        {
            DebugStop();
        }
        TPZFMatrix<REAL> bvec(2,18);
        TPZFMatrix<REAL> t1vec(2,18);
       
        bvec.Redim(2, 18);
        t1vec.Redim(2, 18);
        directions.Redim(3, 18);
        for (int lin = 0; lin<18; lin++)
        {
            for(int col = 0;col<2;col++)
            {
                bvec.PutVal(col, lin, bQuad[lin][col]);
                t1vec.PutVal(col, lin, tQuad[lin][col]);
            }
        }
        // calcula os vetores
        
        switch (side) {
            case 0:
            {
            }
                break;
            case 1:
            {
            }
                break;
            case 2:
            {
            }
                break;
            case 3:
            {
            }
                break;
            case 4:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 0, fnumvec = 2;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip];
                }
                
            }
                break;
            case 5:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 3, fnumvec = 5;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 6:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 6, fnumvec = 8;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 7:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 9, fnumvec = 11;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 8:
            {
                directions.Redim(3, 6);
                sidevectors.Resize(6);
                int inumvec = 12, fnumvec = 17;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 6; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
                
            default:
                DebugStop();
                break;
        }

        
	}